

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOptionCommand.h
# Opt level: O0

cmCommand * __thiscall cmOptionCommand::Clone(cmOptionCommand *this)

{
  cmCommand *this_00;
  cmOptionCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmOptionCommand((cmOptionCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmOptionCommand; }